

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix44<float>::Matrix44(Matrix44<float> *this,float (*a) [4])

{
  float (*a_local) [4];
  Matrix44<float> *this_local;
  
  this->x[0][0] = (*a)[0];
  this->x[0][1] = (*a)[1];
  this->x[0][2] = (*a)[2];
  this->x[0][3] = (*a)[3];
  this->x[1][0] = a[1][0];
  this->x[1][1] = a[1][1];
  this->x[1][2] = a[1][2];
  this->x[1][3] = a[1][3];
  this->x[2][0] = a[2][0];
  this->x[2][1] = a[2][1];
  this->x[2][2] = a[2][2];
  this->x[2][3] = a[2][3];
  this->x[3][0] = a[3][0];
  this->x[3][1] = a[3][1];
  this->x[3][2] = a[3][2];
  this->x[3][3] = a[3][3];
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>::Matrix44 (
    const T a[4][4]) IMATH_NOEXCEPT
{
    x[0][0] = a[0][0];
    x[0][1] = a[0][1];
    x[0][2] = a[0][2];
    x[0][3] = a[0][3];
    x[1][0] = a[1][0];
    x[1][1] = a[1][1];
    x[1][2] = a[1][2];
    x[1][3] = a[1][3];
    x[2][0] = a[2][0];
    x[2][1] = a[2][1];
    x[2][2] = a[2][2];
    x[2][3] = a[2][3];
    x[3][0] = a[3][0];
    x[3][1] = a[3][1];
    x[3][2] = a[3][2];
    x[3][3] = a[3][3];
}